

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DGeneralSamplesNumberTest::iterate
          (MultisampleTextureTexStorage2DGeneralSamplesNumberTest *this)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar5;
  GLint internalformat_max_samples;
  GLint gl_max_samples_value;
  ulong local_38;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_38 = 0xffffffffffffffff;
  (**(code **)(lVar4 + 0x868))(0x8d57);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Failed to retrieve GL_MAX_SAMPLES value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x8e);
  lVar5 = 0;
  do {
    uVar1 = *(undefined4 *)((long)&DAT_01b3b660 + lVar5);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    (**(code **)(lVar4 + 0x880))(0x9100,uVar1,0x80a9,1,&local_38);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetInternalformativ() failed to retrieve GL_SAMPLES value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                    ,0x9e);
    (**(code **)(lVar4 + 0x1390))(0x9100,local_38 & 0xffffffff,uVar1,1,1,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,
                    "glTexStorage2DMultisample() call, for which a valid number of samples was used, has failed."
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                    ,0xa6);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
    (**(code **)(lVar4 + 0x1390))(0x9100,(int)local_38 + 1,uVar1,1,1);
    iVar2 = (**(code **)(lVar4 + 0x800))();
    if (iVar2 != 0x502) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.",
                 "gl.getError() == GL_INVALID_OPERATION",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                 ,0xbc);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x28);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DGeneralSamplesNumberTest::iterate()
{
	/* Test case variables */
	const glw::GLboolean  fixedsamplelocations  = GL_FALSE;
	const glw::Functions& gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum	 internalformat_list[] = { GL_R8,
												GL_RGB565,
												GL_RGB10_A2UI,
												GL_SRGB8_ALPHA8,
												GL_R8I,
												GL_DEPTH_COMPONENT16,
												GL_DEPTH_COMPONENT32F,
												GL_DEPTH24_STENCIL8,
												GL_DEPTH24_STENCIL8,
												GL_DEPTH32F_STENCIL8 };
	const int		   internalformat_list_count  = sizeof(internalformat_list) / sizeof(internalformat_list[0]);
	glw::GLint		   internalformat_max_samples = -1; /* Will be determined later */
	const glw::GLsizei height					  = 1;
	const glw::GLsizei width					  = 1;
	const glw::GLenum  target = GL_TEXTURE_2D_MULTISAMPLE; /* Test case uses GL_TEXTURE_2D_MULTISAMPLE target */
	glw::GLint		   gl_max_samples_value = -1;

	/* Get GL_MAX_SAMPLES value */
	gl.getIntegerv(GL_MAX_SAMPLES, &gl_max_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to retrieve GL_MAX_SAMPLES value");

	/* Iterate through all internal formats test case should check */
	for (int internalformat_index = 0; internalformat_index < internalformat_list_count; internalformat_index++)
	{
		/* Iteration-specific internalformat */
		glw::GLenum internalformat = internalformat_list[internalformat_index];

		/* Subiteration. Case samples = internalformat_max_samples */
		{
			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Retrieve maximum amount of samples available for the target's texture internalformat */
			gl.getInternalformativ(target, internalformat, GL_SAMPLES, 1, &internalformat_max_samples);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed to retrieve GL_SAMPLES value");

			/* Issue call with valid parameters */
			gl.texStorage2DMultisample(target, internalformat_max_samples, internalformat, width, height,
									   fixedsamplelocations);

			GLU_EXPECT_NO_ERROR(
				gl.getError(),
				"glTexStorage2DMultisample() call, for which a valid number of samples was used, has failed.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}

		/* Subiteration. Case: samples > internalformat_max_samples */
		{
			/* Initialize texture object and bind it to GL_TEXTURE_2D_MULTISAMPLE target */
			initInternalIteration();

			/* Issue call with valid parameters, but invalid sample parameter */
			gl.texStorage2DMultisample(target, internalformat_max_samples + 1, internalformat, width, height,
									   fixedsamplelocations);

			/* Check if the expected error code was reported */
			/* From spec:
			 * An INVALID_OPERATION error is generated if samples is greater than the
			 * maximum number of samples supported for this target and internalformat.*/

			/* Expect GL_INVALID_OPERATION error code. */
			TCU_CHECK_MSG(gl.getError() == GL_INVALID_OPERATION,
						  "glTexStorage2DMultisample() did not generate GL_INVALID_OPERATION error.");

			/* Deinitialize texture object and unbind texture object bound to GL_TEXTURE_2D_MULTISAMPLE target */
			deinitInternalIteration();
		}
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}